

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::imageToGrey<float>
               (Image<float,_gimage::PixelTraits<float>_> *ret,
               Image<float,_gimage::PixelTraits<float>_> *image)

{
  bool bVar1;
  long lVar2;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  long unaff_retaddr;
  long in_stack_00000008;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_00000010;
  long i;
  long k;
  float blue;
  float green;
  float red;
  work_t in_stack_ffffffffffffffa8;
  store_t_conflict in_stack_ffffffffffffffac;
  Image<float,_gimage::PixelTraits<float>_> *pIVar3;
  long i_00;
  Image<float,_gimage::PixelTraits<float>_> *local_30;
  long local_28;
  
  pIVar3 = in_RDI;
  Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(long)pIVar3);
  local_28 = 0;
  while (i_00 = local_28, lVar2 = Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI),
        i_00 < lVar2) {
    local_30 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while (pIVar3 = local_30, lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI),
          (long)pIVar3 < lVar2) {
      Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,(long)local_30,local_28,0);
      Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,(long)local_30,local_28,1);
      Image<float,_gimage::PixelTraits<float>_>::get(in_RSI,(long)local_30,local_28,2);
      bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS(pIVar3,in_stack_ffffffffffffffac);
      if (((bVar1) &&
          (bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                             (pIVar3,in_stack_ffffffffffffffac), bVar1)) &&
         (bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValidS
                            (pIVar3,in_stack_ffffffffffffffac), bVar1)) {
        Image<float,_gimage::PixelTraits<float>_>::setLimited
                  (in_RDI,i_00,(long)pIVar3,(int)in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8
                  );
      }
      else {
        Image<float,_gimage::PixelTraits<float>_>::setInvalid
                  (in_RDI,i_00,(long)pIVar3,
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      local_30 = (Image<float,_gimage::PixelTraits<float>_> *)((long)&local_30->depth + 1);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

inline void imageToGrey<float>(Image<float> &ret, const Image<float> &image)
{
  float red, green, blue;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 1);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      red=image.get(i, k, 0);
      green=image.get(i, k, 1);
      blue=image.get(i, k, 2);

      if (image.isValidS(red) && image.isValidS(green) && image.isValidS(blue))
      {
        ret.setLimited(i, k, 0, (9798*red+19234*green+3736*blue)/32768);
      }
      else
      {
        ret.setInvalid(i, k, 0);
      }
    }
  }
}